

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

void __thiscall QDialog::done(QDialog *this,int r)

{
  QDialogPrivate *this_00;
  int iVar1;
  int *piVar2;
  long in_FS_OFFSET;
  int local_3c;
  void *local_38;
  int *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  this_00 = *(QDialogPrivate **)&(this->super_QWidget).field_0x8;
  QDialogPrivate::close(this_00,r);
  if (piVar2 == (int *)0x0) goto LAB_004d8754;
  if (piVar2[1] != 0) {
    iVar1 = (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xb0))(this_00);
    if (iVar1 == 1) {
LAB_004d8705:
      QMetaObject::activate((QObject *)this,&staticMetaObject,iVar1,(void **)0x0);
    }
    else if (iVar1 == 0) {
      iVar1 = 2;
      goto LAB_004d8705;
    }
    if (piVar2[1] != 0) {
      local_30 = &local_3c;
      local_38 = (void *)0x0;
      local_3c = r;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
    }
  }
  LOCK();
  *piVar2 = *piVar2 + -1;
  UNLOCK();
  if (*piVar2 == 0) {
    operator_delete(piVar2);
  }
LAB_004d8754:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::done(int r)
{
    QPointer<QDialog> guard(this);

    Q_D(QDialog);
    d->close(r);

    if (!guard)
        return;

    int dialogCode = d->dialogCode();
    if (dialogCode == QDialog::Accepted)
        emit accepted();
    else if (dialogCode == QDialog::Rejected)
        emit rejected();

    if (guard)
        emit finished(r);
}